

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendGenericRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode,U16 StartingAddress,
          U16 Quantity)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  uint local_48;
  
  if (this->mSettings->mModbusMode < ModbusASCIIClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)FuncCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(StartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(StartingAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Quantity & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(Quantity >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    local_48 = (uint)(StartingAddress >> 8);
    uVar1 = this->crc_tab16
            [(ushort)(this->crc_tab16
                      [(ushort)(this->crc_tab16
                                [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)] >> 8 ^
                               this->crc_tab16
                               [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ StartingAddress ^
                                        this->crc_tab16
                                        [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)]
                                        ) & 0xff]) & 0xff ^ local_48] >> 8 ^
                     this->crc_tab16
                     [(ushort)(this->crc_tab16
                               [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^ StartingAddress ^
                                        this->crc_tab16
                                        [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)]
                                        ) & 0xff] >> 8 ^ Quantity ^
                              this->crc_tab16
                              [(ushort)(this->crc_tab16
                                        [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)]
                                        >> 8 ^ this->crc_tab16
                                               [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                         StartingAddress ^
                                                        this->crc_tab16
                                                        [(byte)~((byte)this->crc_tab16
                                                                       [(byte)~DeviceID] ^ FuncCode)
                                                        ]) & 0xff]) & 0xff ^ local_48]) & 0xff]) &
             0xff ^ (uint)(Quantity >> 8)];
    CreateModbusByte(this,(ulong)((ushort)(this->crc_tab16
                                           [(ushort)(this->crc_tab16
                                                     [(ushort)(this->crc_tab16[(byte)~DeviceID] >> 8
                                                               ^ StartingAddress ^
                                                              this->crc_tab16
                                                              [(byte)~((byte)this->crc_tab16
                                                                             [(byte)~DeviceID] ^
                                                                      FuncCode)]) & 0xff] >> 8 ^
                                                     Quantity ^
                                                    this->crc_tab16
                                                    [(ushort)(this->crc_tab16
                                                              [(byte)~((byte)this->crc_tab16
                                                                             [(byte)~DeviceID] ^
                                                                      FuncCode)] >> 8 ^
                                                             this->crc_tab16
                                                             [(ushort)(this->crc_tab16
                                                                       [(byte)~DeviceID] >> 8 ^
                                                                       StartingAddress ^
                                                                      this->crc_tab16
                                                                      [(byte)~((byte)this->crc_tab16
                                                                                     [(byte)~
                                                  DeviceID] ^ FuncCode)]) & 0xff]) & 0xff ^ local_48
                                                  ]) & 0xff] >> 8 ^ uVar1) & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar1 >> 8);
  }
  else {
    bVar3 = (byte)(StartingAddress >> 8);
    bVar4 = (byte)(Quantity >> 8);
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,FuncCode >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,FuncCode & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,bVar3 >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((StartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)StartingAddress >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(StartingAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,bVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((Quantity & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)Quantity >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(Quantity & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar4 = -(DeviceID + FuncCode + (byte)StartingAddress + bVar3 + (byte)Quantity + bVar4);
    bVar3 = BinToLATIN1(pMVar6,bVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar3 = BinToLATIN1(this_00,bVar4 & 0xf);
    CreateModbusByte(this,(ulong)bVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendGenericRequest( U8 DeviceID, U8 FuncCode, U16 StartingAddress, U16 Quantity )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient || mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( StartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( StartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Quantity & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Quantity & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, FuncCode );
        CRCValue = update_CRC( CRCValue, StartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( StartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Quantity & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Quantity & 0xFF00 ) >> 8 );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + FuncCode;
        LRCvalue = LRCvalue + ( StartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( StartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Quantity & 0x00FF );
        LRCvalue = LRCvalue + ( ( Quantity & 0xFF00 ) >> 8 );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( StartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Quantity & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Quantity & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}